

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpUnSubscribe(UpnpClient_Handle Hnd,char *SubsId)

{
  Upnp_Handle_Type UVar1;
  uint uVar2;
  UpnpString *p;
  Handle_Info **HndInfo;
  Handle_Info *local_20;
  
  p = UpnpString_new();
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x92b,"Inside UpnpUnSubscribe\n");
  if (UpnpSdkInit == 1) {
    if (p == (UpnpString *)0x0) {
      uVar2 = 0xffffff98;
    }
    else if (SubsId == (char *)0x0) {
      uVar2 = 0xffffff9b;
    }
    else {
      UpnpString_set_String(p,SubsId);
      HandleReadLock((char *)0x93c,(int)SubsId);
      HndInfo = &local_20;
      UVar1 = GetHandleInfo(Hnd,HndInfo);
      if (UVar1 == HND_CLIENT) {
        HandleUnlock((char *)0x945,(int)HndInfo);
        uVar2 = genaUnSubscribe(Hnd,p);
      }
      else {
        HandleUnlock((char *)0x941,(int)HndInfo);
        uVar2 = 0xffffff9c;
      }
    }
  }
  else {
    uVar2 = 0xffffff8c;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x94d,"Exiting UpnpUnSubscribe, retVal=%d\n",
             (ulong)uVar2);
  UpnpString_delete(p);
  return uVar2;
}

Assistant:

int UpnpUnSubscribe(UpnpClient_Handle Hnd, const Upnp_SID SubsId)
{
	struct Handle_Info *SInfo = NULL;
	int retVal;
	UpnpString *SubsIdTmp = UpnpString_new();

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpUnSubscribe\n");

	if (UpnpSdkInit != 1) {
		retVal = UPNP_E_FINISH;
		goto exit_function;
	}

	if (SubsIdTmp == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	if (SubsId == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	UpnpString_set_String(SubsIdTmp, SubsId);

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		retVal = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	HandleUnlock(__FILE__, __LINE__);

	retVal = genaUnSubscribe(Hnd, SubsIdTmp);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpUnSubscribe, retVal=%d\n",
		retVal);

	UpnpString_delete(SubsIdTmp);

	return retVal;
}